

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void __thiscall
Logger::writeLog(Logger *this,string *kindOfMessage,string *message,string *location)

{
  ostream *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *location_local;
  string *message_local;
  string *kindOfMessage_local;
  Logger *this_local;
  
  local_28 = location;
  location_local = message;
  message_local = kindOfMessage;
  kindOfMessage_local = (string *)this;
  std::operator+(&local_88,kindOfMessage,message);
  std::operator+(&local_68,&local_88," IN ");
  std::operator+(&local_48,&local_68,local_28);
  std::__cxx11::string::operator=((string *)&this->mLastLog,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  this_00 = std::operator<<((ostream *)this,(string *)&this->mLastLog);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Logger::writeLog(const std::string &kindOfMessage, const std::string &message, const std::string &location) {
    mLastLog = kindOfMessage + message + " IN " + location;
    mLogStream << mLastLog << std::endl;
}